

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
kernel::BlockTreeDB::LoadBlockIndexGuts
          (BlockTreeDB *this,Params *consensusParams,
          function<CBlockIndex_*(const_uint256_&)> insertBlockIndex,SignalInterrupt *interrupt)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  uint256 hash;
  bool bVar2;
  bool bVar3;
  CBlockIndex *this_00;
  CBlockIndex *pCVar4;
  Logger *pLVar5;
  SignalInterrupt *in_RCX;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined4 uVar6;
  undefined4 uVar7;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> pcursor;
  string local_200;
  uint256 local_1e0;
  CDiskBlockIndex diskindex;
  pair<unsigned_char,_uint256> key;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcursor._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       CDBWrapper::NewIterator(&this->super_CDBWrapper);
  diskindex.super_CBlockIndex.pskip._1_7_ = 0;
  diskindex.super_CBlockIndex.nHeight._0_1_ = 0;
  diskindex.super_CBlockIndex._25_7_ = 0;
  diskindex.super_CBlockIndex.nDataPos._0_1_ = 0;
  diskindex.super_CBlockIndex._1_8_ = 0;
  diskindex.super_CBlockIndex._9_8_ = 0;
  diskindex.super_CBlockIndex.phashBlock._0_1_ = 0x62;
  CDBIterator::Seek<std::pair<unsigned_char,uint256>>
            ((CDBIterator *)
             pcursor._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
             .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,
             (pair<unsigned_char,_uint256> *)&diskindex);
  while( true ) {
    bVar2 = CDBIterator::Valid((CDBIterator *)
                               pcursor._M_t.
                               super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                               .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    if (!bVar2) break;
    bVar3 = util::SignalInterrupt::operator_cast_to_bool(in_RCX);
    if (bVar3) break;
    key.second.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    key.first = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    key.second.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    bVar2 = CDBIterator::GetKey<std::pair<unsigned_char,uint256>>
                      ((CDBIterator *)
                       pcursor._M_t.
                       super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key);
    if (!bVar2 || key.first != 'b') {
      bVar2 = true;
      goto LAB_0075e770;
    }
    CDiskBlockIndex::CDiskBlockIndex(&diskindex);
    bVar2 = CDBIterator::GetValue<CDiskBlockIndex>
                      ((CDBIterator *)
                       pcursor._M_t.
                       super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&diskindex);
    if (!bVar2) {
      pLVar5 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar5);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char[19]>
                  (&local_78,"%s: failed to read value\n",(char (*) [19])"LoadBlockIndexGuts");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar5 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5e;
        local_78._M_string_length = 0xcb2cf4;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "LoadBlockIndexGuts";
        logging_function._M_len = 0x12;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x8d,ALL,Error);
        this_01 = &log_msg;
        goto LAB_0075e768;
      }
LAB_0075e76d:
      bVar2 = false;
      goto LAB_0075e770;
    }
    CDiskBlockIndex::ConstructBlockHash((uint256 *)&log_msg,&diskindex);
    this_00 = std::function<CBlockIndex_*(const_uint256_&)>::operator()
                        ((function<CBlockIndex_*(const_uint256_&)> *)interrupt,(uint256 *)&log_msg);
    pCVar4 = std::function<CBlockIndex_*(const_uint256_&)>::operator()
                       ((function<CBlockIndex_*(const_uint256_&)> *)interrupt,
                        (uint256 *)&diskindex.super_CBlockIndex.field_0x94);
    this_00->pprev = pCVar4;
    this_00->nHeight =
         (int)CONCAT71(diskindex.super_CBlockIndex._25_7_,
                       (undefined1)diskindex.super_CBlockIndex.nHeight);
    this_00->nFile = diskindex.super_CBlockIndex.nFile;
    this_00->nDataPos =
         (int)CONCAT71(diskindex.super_CBlockIndex._33_7_,
                       (undefined1)diskindex.super_CBlockIndex.nDataPos);
    this_00->nUndoPos = diskindex.super_CBlockIndex.nUndoPos;
    this_00->nVersion = diskindex.super_CBlockIndex.nVersion;
    *(undefined8 *)(this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems =
         diskindex.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) =
         diskindex.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) =
         diskindex.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) =
         diskindex.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_;
    this_00->nTime = diskindex.super_CBlockIndex.nTime;
    this_00->nBits = diskindex.super_CBlockIndex.nBits;
    this_00->nNonce = diskindex.super_CBlockIndex.nNonce;
    this_00->nStatus = diskindex.super_CBlockIndex.nStatus;
    this_00->nTx = diskindex.super_CBlockIndex.nTx;
    CBlockIndex::GetBlockHash(&local_1e0,this_00);
    uVar6 = local_1e0.super_base_blob<256U>.m_data._M_elems._24_4_;
    uVar7 = local_1e0.super_base_blob<256U>.m_data._M_elems._28_4_;
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_1e0.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)uVar6;
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((uint)uVar6 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((uint)uVar6 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((uint)uVar6 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)uVar7;
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((uint)uVar7 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((uint)uVar7 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((uint)uVar7 >> 0x18);
    bVar2 = CheckProofOfWork(hash,this_00->nBits,consensusParams);
    if (!bVar2) {
      CBlockIndex::ToString_abi_cxx11_(&local_200,this_00);
      pLVar5 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar5);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<char[19],std::__cxx11::string>
                  (&local_78,(tinyformat *)"%s: CheckProofOfWork failed: %s\n","LoadBlockIndexGuts",
                   (char (*) [19])&local_200,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar5 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x5e;
        local_78._M_string_length = 0xcb2cf4;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_00._M_len = 0x5e;
        str_00._M_str = log_msg._M_dataplus._M_p;
        str_00._M_len = log_msg._M_string_length;
        logging_function_00._M_str = "LoadBlockIndexGuts";
        logging_function_00._M_len = 0x12;
        BCLog::Logger::LogPrintStr(pLVar5,str_00,logging_function_00,source_file_00,0x87,ALL,Error);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      this_01 = &local_200;
LAB_0075e768:
      std::__cxx11::string::~string((string *)this_01);
      goto LAB_0075e76d;
    }
    CDBIterator::Next((CDBIterator *)
                      pcursor._M_t.
                      super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                      super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                      super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
  }
  bVar2 = !bVar2;
LAB_0075e770:
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&pcursor);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::LoadBlockIndexGuts(const Consensus::Params& consensusParams, std::function<CBlockIndex*(const uint256&)> insertBlockIndex, const util::SignalInterrupt& interrupt)
{
    AssertLockHeld(::cs_main);
    std::unique_ptr<CDBIterator> pcursor(NewIterator());
    pcursor->Seek(std::make_pair(DB_BLOCK_INDEX, uint256()));

    // Load m_block_index
    while (pcursor->Valid()) {
        if (interrupt) return false;
        std::pair<uint8_t, uint256> key;
        if (pcursor->GetKey(key) && key.first == DB_BLOCK_INDEX) {
            CDiskBlockIndex diskindex;
            if (pcursor->GetValue(diskindex)) {
                // Construct block index object
                CBlockIndex* pindexNew = insertBlockIndex(diskindex.ConstructBlockHash());
                pindexNew->pprev          = insertBlockIndex(diskindex.hashPrev);
                pindexNew->nHeight        = diskindex.nHeight;
                pindexNew->nFile          = diskindex.nFile;
                pindexNew->nDataPos       = diskindex.nDataPos;
                pindexNew->nUndoPos       = diskindex.nUndoPos;
                pindexNew->nVersion       = diskindex.nVersion;
                pindexNew->hashMerkleRoot = diskindex.hashMerkleRoot;
                pindexNew->nTime          = diskindex.nTime;
                pindexNew->nBits          = diskindex.nBits;
                pindexNew->nNonce         = diskindex.nNonce;
                pindexNew->nStatus        = diskindex.nStatus;
                pindexNew->nTx            = diskindex.nTx;

                if (!CheckProofOfWork(pindexNew->GetBlockHash(), pindexNew->nBits, consensusParams)) {
                    LogError("%s: CheckProofOfWork failed: %s\n", __func__, pindexNew->ToString());
                    return false;
                }

                pcursor->Next();
            } else {
                LogError("%s: failed to read value\n", __func__);
                return false;
            }
        } else {
            break;
        }
    }

    return true;
}